

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu540c.c
# Opt level: O0

MPP_RET hal_h264e_vepu540c_start(void *hal,HalEncTask *task)

{
  long local_48;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  HalH264eVepu540cCtx *ctx;
  MPP_RET ret;
  HalEncTask *task_local;
  void *hal_local;
  
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","enter %p\n","hal_h264e_vepu540c_start",hal);
  }
  rd_cfg._8_8_ = *(undefined8 *)((long)hal + 0x160);
  ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&rd_cfg.size);
  if (ctx._4_4_ == MPP_OK) {
    rd_cfg._8_8_ = *(long *)((long)hal + 0x160) + 100;
    ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&rd_cfg.size);
    if (ctx._4_4_ == MPP_OK) {
      rd_cfg._8_8_ = *(long *)((long)hal + 0x160) + 0x278;
      ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&rd_cfg.size);
      if (ctx._4_4_ == MPP_OK) {
        rd_cfg._8_8_ = *(long *)((long)hal + 0x160) + 0x388;
        ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&rd_cfg.size);
        if (ctx._4_4_ == MPP_OK) {
          rd_cfg._8_8_ = *(long *)((long)hal + 0x160) + 0x658;
          ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&rd_cfg.size);
          if (ctx._4_4_ == MPP_OK) {
            rd_cfg._8_8_ = *(long *)((long)hal + 0x160) + 0x758;
            ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&rd_cfg.size);
            if (ctx._4_4_ == MPP_OK) {
              local_48 = *(long *)((long)hal + 0x160) + 0x1378;
              rd_cfg.reg._0_4_ = 0x250;
              rd_cfg.reg._4_4_ = 0x4000;
              ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),5,&local_48);
              if (ctx._4_4_ == MPP_OK) {
                ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),0xf,(void *)0x0);
                if (ctx._4_4_ != MPP_OK) {
                  _mpp_log_l(2,"hal_h264e_vepu540c","send cmd failed %d\n",
                             "hal_h264e_vepu540c_start",(ulong)(uint)ctx._4_4_);
                }
              }
              else {
                _mpp_log_l(2,"hal_h264e_vepu540c","set register read failed %d\n",
                           "hal_h264e_vepu540c_start",(ulong)(uint)ctx._4_4_);
              }
            }
            else {
              _mpp_log_l(2,"hal_h264e_vepu540c","set register write failed %d\n",
                         "hal_h264e_vepu540c_start",(ulong)(uint)ctx._4_4_);
            }
          }
          else {
            _mpp_log_l(2,"hal_h264e_vepu540c","set register write failed %d\n",
                       "hal_h264e_vepu540c_start",(ulong)(uint)ctx._4_4_);
          }
        }
        else {
          _mpp_log_l(2,"hal_h264e_vepu540c","set register write failed %d\n",
                     "hal_h264e_vepu540c_start",(ulong)(uint)ctx._4_4_);
        }
      }
      else {
        _mpp_log_l(2,"hal_h264e_vepu540c","set register write failed %d\n",
                   "hal_h264e_vepu540c_start",(ulong)(uint)ctx._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"hal_h264e_vepu540c","set register write failed %d\n","hal_h264e_vepu540c_start",
                 (ulong)(uint)ctx._4_4_);
    }
  }
  else {
    _mpp_log_l(2,"hal_h264e_vepu540c","set register write failed %d\n","hal_h264e_vepu540c_start",
               (ulong)(uint)ctx._4_4_);
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","leave %p\n","hal_h264e_vepu540c_start",hal);
  }
  return ctx._4_4_;
}

Assistant:

static MPP_RET hal_h264e_vepu540c_start(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalH264eVepu540cCtx *ctx = (HalH264eVepu540cCtx *)hal;

    (void) task;

    hal_h264e_dbg_func("enter %p\n", hal);

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = &ctx->regs_set->reg_ctl;
        wr_cfg.size = sizeof(ctx->regs_set->reg_ctl);
        wr_cfg.offset = VEPU540C_CTL_OFFSET;
#if DUMP_REG
        {
            RK_U32 i;
            RK_U32 *reg = (RK_U32)wr_cfg.reg;
            for ( i = 0; i < sizeof(ctx->regs_set->reg_ctl) / sizeof(RK_U32); i++) {
                /* code */
                mpp_log("reg[%d] = 0x%08x\n", i, reg[i]);
            }

        }
#endif
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }
        wr_cfg.reg = &ctx->regs_set->reg_base;
        wr_cfg.size = sizeof(ctx->regs_set->reg_base);
        wr_cfg.offset = VEPU540C_BASE_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }
        wr_cfg.reg = &ctx->regs_set->reg_rc_roi;
        wr_cfg.size = sizeof(ctx->regs_set->reg_rc_roi);
        wr_cfg.offset = VEPU540C_RCROI_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }
        wr_cfg.reg = &ctx->regs_set->reg_s3;
        wr_cfg.size = sizeof(ctx->regs_set->reg_s3);
        wr_cfg.offset = VEPU540C_WEG_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }
        wr_cfg.reg = &ctx->regs_set->reg_rdo;
        wr_cfg.size = sizeof(ctx->regs_set->reg_rdo);
        wr_cfg.offset = VEPU540C_RDOCFG_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &ctx->regs_set->reg_scl;
        wr_cfg.size = sizeof(ctx->regs_set->reg_scl);
        wr_cfg.offset = VEPU540C_SCLCFG_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &ctx->regs_set->reg_st;
        rd_cfg.size = sizeof(ctx->regs_set->reg_st);
        rd_cfg.offset = VEPU540C_STATUS_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }
        /* send request to hardware */
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);

        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    hal_h264e_dbg_func("leave %p\n", hal);

    return ret;
}